

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  string *psVar2;
  Type *proto_00;
  iterator iVar3;
  long lVar4;
  int i;
  long lVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_bool>
  pVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  seen_types;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  local_b0;
  RepeatedPtrFieldBase *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = &(proto->nested_type_).super_RepeatedPtrFieldBase;
  lVar4 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x48); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(message + 0x50);
    std::__cxx11::string::string((string *)&local_b0,*(string **)(lVar1 + lVar4));
    local_b0.second = (Descriptor *)(lVar4 + lVar1);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,google::protobuf::Descriptor_const*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
                        *)&local_60,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if ((((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((*(char *)(*(long *)(*(long *)(pVar6.first._M_node._M_node + 2) + 0x20) + 0x6b) != '\0' ||
        (*(char *)(*(long *)(lVar1 + 0x20 + lVar4) + 0x6b) == '\x01')))) {
      psVar2 = *(string **)(message + 8);
      std::operator+(&local_80,"Expanded map entry type ",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar4 + lVar1));
      std::operator+(&local_b0.first,&local_80," conflicts with an existing nested message type.");
      AddError(this,psVar2,&proto->super_Message,NAME,&local_b0.first);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar1 = *(long *)(message + 0x50);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (local_88,(int)lVar5);
    DetectMapConflicts(this,(Descriptor *)(lVar1 + lVar4),proto_00);
    lVar4 = lVar4 + 0xa8;
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x2c); lVar4 = lVar4 + 1) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
            ::find(&local_60,*(key_type **)(*(long *)(message + 0x30) + lVar5));
    if (((_Rb_tree_header *)iVar3._M_node != &local_60._M_impl.super__Rb_tree_header) &&
       (*(char *)((*(undefined8 **)(iVar3._M_node + 2))[4] + 0x6b) == '\x01')) {
      psVar2 = *(string **)(message + 8);
      std::operator+(&local_80,"Expanded map entry type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     **(undefined8 **)(iVar3._M_node + 2));
      std::operator+(&local_b0.first,&local_80," conflicts with an existing field.");
      AddError(this,psVar2,&proto->super_Message,NAME,&local_b0.first);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar5 = lVar5 + 0xa8;
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x58); lVar4 = lVar4 + 1) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
            ::find(&local_60,*(key_type **)(*(long *)(message + 0x60) + lVar5));
    if (((_Rb_tree_header *)iVar3._M_node != &local_60._M_impl.super__Rb_tree_header) &&
       (*(char *)((*(undefined8 **)(iVar3._M_node + 2))[4] + 0x6b) == '\x01')) {
      psVar2 = *(string **)(message + 8);
      std::operator+(&local_80,"Expanded map entry type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     **(undefined8 **)(iVar3._M_node + 2));
      std::operator+(&local_b0.first,&local_80," conflicts with an existing enum type.");
      AddError(this,psVar2,&proto->super_Message,NAME,&local_b0.first);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar5 = lVar5 + 0x38;
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x38); lVar4 = lVar4 + 1) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
            ::find(&local_60,*(key_type **)(*(long *)(message + 0x40) + lVar5));
    if (((_Rb_tree_header *)iVar3._M_node != &local_60._M_impl.super__Rb_tree_header) &&
       (*(char *)((*(undefined8 **)(iVar3._M_node + 2))[4] + 0x6b) == '\x01')) {
      psVar2 = *(string **)(message + 8);
      std::operator+(&local_80,"Expanded map entry type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     **(undefined8 **)(iVar3._M_node + 2));
      std::operator+(&local_b0.first,&local_80," conflicts with an existing oneof type.");
      AddError(this,psVar2,&proto->super_Message,NAME,&local_b0.first);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar5 = lVar5 + 0x30;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  std::map<string, const Descriptor*> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    std::pair<std::map<string, const Descriptor*>::iterator, bool> result =
        seen_types.insert(std::make_pair(nested->name(), nested));
    if (!result.second) {
      if (result.first->second->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME,
                 "Expanded map entry type " + nested->name() +
                 " conflicts with an existing nested message type.");
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(field->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing field.");
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing enum type.");
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    std::map<string, const Descriptor*>::iterator iter =
        seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
               " conflicts with an existing oneof type.");
    }
  }
}